

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O1

bool __thiscall DropdownMenu::update(DropdownMenu *this,int mouseX,int mouseY,bool clicked)

{
  Transformable *this_00;
  pointer pTVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  Vector2f *pVVar6;
  uint uVar7;
  uint mouseY_00;
  TextButton *b;
  pointer pTVar8;
  uint mouseX_00;
  
  uVar7 = (uint)clicked;
  this_00 = &(this->super_UIComponent).super_Transformable;
  pVVar6 = sf::Transformable::getPosition(this_00);
  mouseX_00 = mouseX - (int)pVVar6->x;
  pVVar6 = sf::Transformable::getPosition(this_00);
  mouseY_00 = mouseY - (int)pVVar6->y;
  if ((this->super_UIComponent).super_Transformable.field_0xa9 == '\x01') {
    pTVar8 = (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl
             .super__Vector_impl_data._M_start;
    pTVar1 = (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (pTVar8 != pTVar1) {
      bVar3 = false;
      do {
        iVar5 = (*(pTVar8->super_UIComponent).super_Drawable._vptr_Drawable[3])
                          (pTVar8,(ulong)mouseX_00,(ulong)mouseY_00,(ulong)(uVar7 & 1));
        uVar2 = 0;
        if ((char)iVar5 == '\0') {
          uVar2 = uVar7;
        }
        uVar7 = uVar2;
        if (pTVar8->selected == true) {
          if (bVar3) {
            sf::Shape::setFillColor(&(pTVar8->button).super_Shape,&pTVar8->color1);
            pTVar8->selected = false;
          }
          else {
            bVar3 = true;
          }
        }
        pTVar8 = pTVar8 + 1;
      } while (pTVar8 != pTVar1);
    }
  }
  bVar3 = TextButton::update(&this->button,mouseX_00,mouseY_00,clicked);
  if (bVar3) {
    bVar4 = (this->super_UIComponent).super_Transformable.field_0xa9 ^ 1;
  }
  else {
    if (!clicked) {
      return false;
    }
    bVar4 = 0;
  }
  (this->super_UIComponent).super_Transformable.field_0xa9 = bVar4;
  return false;
}

Assistant:

bool DropdownMenu::update(int mouseX, int mouseY, bool clicked) {
    mouseX -= static_cast<int>(getPosition().x);
    mouseY -= static_cast<int>(getPosition().y);
    if (visible) {
        bool clickDone = clicked, buttonSelected = false;
        for (TextButton& b : menuButtons) {
            if (b.update(mouseX, mouseY, clickDone)) {    // Only one button in the menu can be pressed.
                clickDone = false;
            }
            if (b.selected && !buttonSelected) {
                buttonSelected = true;
            } else if (b.selected) {
                b.button.setFillColor(b.color1);
                b.selected = false;
            }
        }
    }
    if (button.update(mouseX, mouseY, clicked)) {
        visible = !visible;
    } else if (clicked) {
        visible = false;
    }
    return false;
}